

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

void xmlRelaxNGFreeValidCtxt(xmlRelaxNGValidCtxtPtr ctxt)

{
  uint uVar1;
  int iVar2;
  xmlRelaxNGValidStatePtr pxVar3;
  xmlRegExecCtxtPtr *ppxVar4;
  xmlRegExecCtxtPtr pxVar5;
  xmlRegExecCtxtPtr exec;
  xmlRelaxNGStatesPtr pxVar6;
  long lVar7;
  
  if (ctxt == (xmlRelaxNGValidCtxtPtr)0x0) {
    return;
  }
  pxVar6 = ctxt->states;
  if (pxVar6 != (xmlRelaxNGStatesPtr)0x0) {
    (*xmlFree)(pxVar6->tabState);
    (*xmlFree)(pxVar6);
  }
  if (ctxt->freeState != (xmlRelaxNGStatesPtr)0x0) {
    pxVar6 = ctxt->freeState;
    if (0 < pxVar6->nbState) {
      lVar7 = 0;
      do {
        pxVar3 = pxVar6->tabState[lVar7];
        if (pxVar3 != (xmlRelaxNGValidStatePtr)0x0) {
          if (pxVar3->attrs != (xmlAttrPtr *)0x0) {
            (*xmlFree)(pxVar3->attrs);
          }
          (*xmlFree)(pxVar3);
        }
        lVar7 = lVar7 + 1;
        pxVar6 = ctxt->freeState;
      } while (lVar7 < pxVar6->nbState);
    }
    (*xmlFree)(pxVar6->tabState);
    (*xmlFree)(pxVar6);
  }
  if (ctxt->freeStates != (xmlRelaxNGStatesPtr *)0x0) {
    if (0 < ctxt->freeStatesNr) {
      lVar7 = 0;
      do {
        pxVar6 = ctxt->freeStates[lVar7];
        if (pxVar6 != (xmlRelaxNGStatesPtr)0x0) {
          (*xmlFree)(pxVar6->tabState);
          (*xmlFree)(pxVar6);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < ctxt->freeStatesNr);
    }
    (*xmlFree)(ctxt->freeStates);
  }
  if (ctxt->errTab != (xmlRelaxNGValidErrorPtr)0x0) {
    (*xmlFree)(ctxt->errTab);
  }
  ppxVar4 = ctxt->elemTab;
  if (ppxVar4 != (xmlRegExecCtxtPtr *)0x0) {
    iVar2 = ctxt->elemNr;
    if (iVar2 < 1) goto LAB_00182a62;
    uVar1 = iVar2 - 1;
    ctxt->elemNr = uVar1;
    exec = ppxVar4[uVar1];
    ppxVar4[uVar1] = (xmlRegExecCtxtPtr)0x0;
    if (iVar2 == 1) {
      pxVar5 = (xmlRegExecCtxtPtr)0x0;
    }
    else {
      pxVar5 = ctxt->elemTab[(ulong)uVar1 - 1];
    }
    do {
      ctxt->elem = pxVar5;
      while( true ) {
        while( true ) {
          if (exec == (xmlRegExecCtxtPtr)0x0) {
            (*xmlFree)(ctxt->elemTab);
            goto LAB_00182acd;
          }
          xmlRegFreeExecCtxt(exec);
          iVar2 = ctxt->elemNr;
          if (0 < iVar2) break;
LAB_00182a62:
          exec = (xmlRegExecCtxtPtr)0x0;
        }
        uVar1 = iVar2 - 1;
        ctxt->elemNr = uVar1;
        exec = ctxt->elemTab[uVar1];
        ctxt->elemTab[uVar1] = (xmlRegExecCtxtPtr)0x0;
        if (iVar2 != 1) break;
        ctxt->elem = (xmlRegExecCtxtPtr)0x0;
      }
      pxVar5 = ctxt->elemTab[(ulong)uVar1 - 1];
    } while( true );
  }
LAB_00182acd:
  (*xmlFree)(ctxt);
  return;
}

Assistant:

void
xmlRelaxNGFreeValidCtxt(xmlRelaxNGValidCtxtPtr ctxt)
{
    int k;

    if (ctxt == NULL)
        return;
    if (ctxt->states != NULL)
        xmlRelaxNGFreeStates(NULL, ctxt->states);
    if (ctxt->freeState != NULL) {
        for (k = 0; k < ctxt->freeState->nbState; k++) {
            xmlRelaxNGFreeValidState(NULL, ctxt->freeState->tabState[k]);
        }
        xmlRelaxNGFreeStates(NULL, ctxt->freeState);
    }
    if (ctxt->freeStates != NULL) {
        for (k = 0; k < ctxt->freeStatesNr; k++) {
            xmlRelaxNGFreeStates(NULL, ctxt->freeStates[k]);
        }
        xmlFree(ctxt->freeStates);
    }
    if (ctxt->errTab != NULL)
        xmlFree(ctxt->errTab);
    if (ctxt->elemTab != NULL) {
        xmlRegExecCtxtPtr exec;

        exec = xmlRelaxNGElemPop(ctxt);
        while (exec != NULL) {
            xmlRegFreeExecCtxt(exec);
            exec = xmlRelaxNGElemPop(ctxt);
        }
        xmlFree(ctxt->elemTab);
    }
    xmlFree(ctxt);
}